

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O0

ImageChannelValues * __thiscall pbrt::Image::GetChannels(Image *this,Point2i p,WrapMode2D wrapMode)

{
  span<float> vout;
  span<const_unsigned_char> vin;
  WrapMode2D wrapMode_00;
  Point2i resolution;
  bool bVar1;
  int iVar2;
  int iVar3;
  size_t index;
  const_reference ptr;
  const_reference this_00;
  reference pvVar4;
  const_reference pvVar5;
  int *in_RSI;
  undefined8 in_RDI;
  float fVar6;
  int i_1;
  int i;
  size_t pixelOffset;
  ImageChannelValues *cv;
  undefined4 in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffeec;
  value_type_conflict1 vVar7;
  Tuple2<pbrt::Point2,_int> in_stack_fffffffffffffef0;
  undefined4 in_stack_ffffffffffffff00;
  Float in_stack_ffffffffffffff04;
  size_t in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff14;
  undefined8 in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff24;
  Point2i *in_stack_ffffffffffffff48;
  WrapMode in_stack_ffffffffffffff54;
  WrapMode in_stack_ffffffffffffff58;
  int in_stack_ffffffffffffff5c;
  int iVar8;
  undefined4 uStack_9c;
  int local_80;
  int local_7c;
  float *in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff94;
  uchar *in_stack_ffffffffffffff98;
  LogLevel in_stack_ffffffffffffffa4;
  
  iVar8 = (int)in_RDI;
  uStack_9c = (undefined4)((ulong)in_RDI >> 0x20);
  NChannels((Image *)0x8752e4);
  ImageChannelValues::ImageChannelValues
            ((ImageChannelValues *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
             in_stack_ffffffffffffff08,in_stack_ffffffffffffff04);
  resolution.super_Tuple2<pbrt::Point2,_int>.y = iVar8;
  resolution.super_Tuple2<pbrt::Point2,_int>.x = in_stack_ffffffffffffff5c;
  wrapMode_00.wrap.values[1] = in_stack_ffffffffffffff58;
  wrapMode_00.wrap.values[0] = in_stack_ffffffffffffff54;
  bVar1 = RemapPixelCoords(in_stack_ffffffffffffff48,resolution,wrapMode_00);
  if (bVar1) {
    index = PixelOffset((Image *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),
                        (Point2i)in_stack_fffffffffffffef0);
    iVar2 = *in_RSI;
    if (iVar2 == 0) {
      ptr = pstd::vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_>::
            operator[]((vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_> *)
                       (in_RSI + 0x2e),index);
      iVar2 = NChannels((Image *)0x875439);
      pstd::span<const_unsigned_char>::span
                ((span<const_unsigned_char> *)&stack0xffffffffffffff98,ptr,(long)iVar2);
      pvVar4 = InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>::operator[]
                         ((InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_> *)
                          in_stack_fffffffffffffef0,
                          CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
      iVar2 = NChannels((Image *)0x87547f);
      pstd::span<float>::span((span<float> *)&stack0xffffffffffffff88,pvVar4,(long)iVar2);
      vin.n._0_4_ = in_stack_ffffffffffffff20;
      vin.ptr = (uchar *)in_stack_ffffffffffffff18;
      vin.n._4_4_ = in_stack_ffffffffffffff24;
      vout.n._0_4_ = in_stack_ffffffffffffff10;
      vout.ptr = (float *)in_stack_ffffffffffffff08;
      vout.n._4_4_ = in_stack_ffffffffffffff14;
      ColorEncodingHandle::ToLinear
                ((ColorEncodingHandle *)
                 CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),vin,vout);
    }
    else if (iVar2 == 1) {
      local_7c = 0;
      while (iVar2 = local_7c, iVar3 = NChannels((Image *)0x8754f4), iVar2 < iVar3) {
        this_00 = pstd::vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_>::
                  operator[]((vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_> *)
                             (in_RSI + 0x36),index + (long)local_7c);
        fVar6 = Half::operator_cast_to_float(this_00);
        pvVar4 = InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>::operator[]
                           ((InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_> *)
                            in_stack_fffffffffffffef0,
                            CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
        *pvVar4 = fVar6;
        local_7c = local_7c + 1;
      }
    }
    else {
      if (iVar2 != 2) {
        LogFatal(in_stack_ffffffffffffffa4,(char *)in_stack_ffffffffffffff98,
                 in_stack_ffffffffffffff94,(char *)in_stack_ffffffffffffff88);
      }
      local_80 = 0;
      while (iVar2 = local_80, iVar3 = NChannels((Image *)0x8755b3), iVar2 < iVar3) {
        pvVar5 = pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::operator[]
                           ((vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)
                            (in_RSI + 0x3e),index + (long)local_80);
        vVar7 = *pvVar5;
        in_stack_fffffffffffffef0 =
             (Tuple2<pbrt::Point2,_int>)
             InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>::operator[]
                       ((InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_> *)
                        in_stack_fffffffffffffef0,CONCAT44(vVar7,in_stack_fffffffffffffee8));
        *(value_type_conflict1 *)in_stack_fffffffffffffef0 = vVar7;
        local_80 = local_80 + 1;
      }
    }
  }
  return (ImageChannelValues *)CONCAT44(uStack_9c,iVar8);
}

Assistant:

ImageChannelValues Image::GetChannels(Point2i p, WrapMode2D wrapMode) const {
    ImageChannelValues cv(NChannels(), Float(0));
    if (!RemapPixelCoords(&p, resolution, wrapMode))
        return cv;

    size_t pixelOffset = PixelOffset(p);
    switch (format) {
    case PixelFormat::U256: {
        encoding.ToLinear({&p8[pixelOffset], size_t(NChannels())},
                          {&cv[0], size_t(NChannels())});
        break;
    }
    case PixelFormat::Half: {
        for (int i = 0; i < NChannels(); ++i)
            cv[i] = Float(p16[pixelOffset + i]);
        break;
    }
    case PixelFormat::Float: {
        for (int i = 0; i < NChannels(); ++i)
            cv[i] = p32[pixelOffset + i];
        break;
    }
    default:
        LOG_FATAL("Unhandled PixelFormat");
    }

    return cv;
}